

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# EAMAdapter.cpp
# Opt level: O0

void __thiscall
OpenMD::EAMAdapter::makeZhou2005
          (EAMAdapter *this,string *latticeType,RealType re,RealType fe,RealType rhoe,RealType rhos,
          RealType alpha,RealType beta,RealType A,RealType B,RealType kappa,RealType lambda,
          vector<double,_std::allocator<double>_> *Fn,vector<double,_std::allocator<double>_> *F,
          RealType F3plus,RealType F3minus,RealType eta,RealType Fe)

{
  double dVar1;
  bool bVar2;
  string *in_RSI;
  undefined4 in_XMM0_Da;
  undefined4 in_XMM0_Db;
  undefined4 in_XMM1_Da;
  undefined4 in_XMM1_Db;
  pointer in_XMM2_Qa;
  pointer in_XMM3_Qa;
  pointer in_XMM4_Qa;
  pointer in_XMM5_Qa;
  pointer in_XMM6_Qa;
  RealType in_XMM7_Qa;
  pointer in_stack_00000030;
  ZhouParameters zhouParam;
  EAMParameters eamParam;
  string *in_stack_fffffffffffffd88;
  AtomType *in_stack_fffffffffffffd90;
  ZhouParameters *this_00;
  locale *in_stack_fffffffffffffda8;
  ZhouParameters *in_stack_fffffffffffffdb0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffdb8;
  shared_ptr<OpenMD::GenericData> *in_stack_fffffffffffffe08;
  AtomType *in_stack_fffffffffffffe10;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe28;
  vector<double,_std::allocator<double>_> *in_stack_fffffffffffffe30;
  locale local_1a8 [8];
  pointer local_1a0;
  pointer local_198;
  pointer local_190;
  pointer local_188;
  pointer local_180;
  pointer local_178;
  RealType local_170;
  RealType local_168;
  RealType local_160;
  RealType local_158;
  RealType RStack_150;
  RealType local_148;
  RealType local_140;
  RealType RStack_138;
  RealType local_130;
  pointer local_128;
  pointer local_120;
  pointer local_118;
  pointer local_110;
  pointer local_108;
  pointer local_100;
  pointer local_f8;
  pointer local_f0;
  pointer local_e8;
  RealType local_e0;
  undefined8 uStack_d8;
  undefined8 local_d0;
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined8 uStack_a8;
  undefined8 local_a0;
  undefined8 local_98;
  undefined4 local_90;
  string local_88 [32];
  pointer local_68;
  RealType local_50;
  pointer local_48;
  pointer local_40;
  pointer local_38;
  pointer local_30;
  pointer local_28;
  pointer local_20;
  pointer local_18;
  
  local_18 = (pointer)CONCAT44(in_XMM0_Db,in_XMM0_Da);
  local_20 = (pointer)CONCAT44(in_XMM1_Db,in_XMM1_Da);
  local_50 = in_XMM7_Qa;
  local_48 = in_XMM6_Qa;
  local_40 = in_XMM5_Qa;
  local_38 = in_XMM4_Qa;
  local_30 = in_XMM3_Qa;
  local_28 = in_XMM2_Qa;
  bVar2 = isEAM((EAMAdapter *)0x291a8c);
  if (bVar2) {
    AtomType::removeProperty(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
    AtomType::removeProperty(in_stack_fffffffffffffd90,in_stack_fffffffffffffd88);
  }
  local_90 = 0;
  std::__cxx11::string::string(local_88);
  local_68 = (pointer)0x0;
  local_1a0 = (pointer)0x0;
  local_198 = (pointer)0x0;
  local_190 = (pointer)0x0;
  local_188 = (pointer)0x0;
  local_180 = (pointer)0x0;
  local_178 = (pointer)0x0;
  local_170 = 0.0;
  local_168 = 0.0;
  local_160 = 0.0;
  local_158 = 0.0;
  RStack_150 = 0.0;
  local_148 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x291b73);
  local_140 = 0.0;
  RStack_138 = 0.0;
  local_130 = 0.0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x291b99);
  local_128 = (pointer)0x0;
  local_120 = (pointer)0x0;
  local_118 = (pointer)0x0;
  local_110 = (pointer)0x0;
  local_108 = (pointer)0x0;
  local_100 = (pointer)0x0;
  local_f8 = (pointer)0x0;
  local_f0 = (pointer)0x0;
  local_e8 = (pointer)0x0;
  local_e0 = 0.0;
  uStack_d8 = 0;
  local_d0 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x291c2b);
  local_c8 = 0;
  uStack_c0 = 0;
  local_b8 = 0;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x291c51);
  local_b0 = 0;
  uStack_a8 = 0;
  local_a0 = 0;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector((vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
            *)0x291c77);
  local_98 = 0;
  local_90 = 3;
  std::locale::locale(local_1a8);
  toUpper<std::__cxx11::string>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdb0,in_stack_fffffffffffffda8);
  std::locale::~locale(local_1a8);
  std::__cxx11::string::operator=(local_88,in_RSI);
  bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
  if (bVar2) {
    local_68 = local_18;
  }
  else {
    bVar2 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            in_stack_fffffffffffffd90,(char *)in_stack_fffffffffffffd88);
    if (bVar2) {
      in_stack_fffffffffffffdb8 =
           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
           ((double)local_18 * 2.0);
      dVar1 = sqrt(3.0);
      local_68 = (pointer)((double)in_stack_fffffffffffffdb8 / dVar1);
    }
    else {
      in_stack_fffffffffffffdb0 = (ZhouParameters *)((double)local_18 * 2.0);
      dVar1 = sqrt(2.0);
      local_68 = (pointer)((double)in_stack_fffffffffffffdb0 / dVar1);
    }
  }
  local_1a0 = local_18;
  local_198 = local_20;
  local_190 = local_28;
  local_188 = local_38;
  local_180 = local_40;
  local_178 = local_48;
  local_170 = local_50;
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  std::vector<double,_std::allocator<double>_>::operator=
            (in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_120 = in_stack_00000030;
  local_118 = local_30;
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,std::__cxx11::string_const&,OpenMD::EAMParameters&>
            (in_stack_fffffffffffffdb8,(EAMParameters *)in_stack_fffffffffffffdb0);
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)in_stack_fffffffffffffd90,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)in_stack_fffffffffffffd88
            );
  AtomType::addProperty(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x291f69);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::EAMParameters>_> *)0x291f76);
  std::
  make_shared<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,std::__cxx11::string_const&,OpenMD::ZhouParameters&>
            (in_stack_fffffffffffffdb8,in_stack_fffffffffffffdb0);
  this_00 = (ZhouParameters *)&stack0xfffffffffffffe18;
  std::shared_ptr<OpenMD::GenericData>::
  shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>,void>
            ((shared_ptr<OpenMD::GenericData> *)this_00,
             (shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)
             in_stack_fffffffffffffd88);
  AtomType::addProperty(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
  std::shared_ptr<OpenMD::GenericData>::~shared_ptr((shared_ptr<OpenMD::GenericData> *)0x291fd9);
  std::shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_>::~shared_ptr
            ((shared_ptr<OpenMD::SimpleTypeData<OpenMD::ZhouParameters>_> *)0x291fe6);
  ZhouParameters::~ZhouParameters(this_00);
  EAMParameters::~EAMParameters((EAMParameters *)0x292000);
  return;
}

Assistant:

void EAMAdapter::makeZhou2005(std::string latticeType, RealType re,
                                RealType fe, RealType rhoe, RealType rhos,
                                RealType alpha, RealType beta, RealType A,
                                RealType B, RealType kappa, RealType lambda,
                                std::vector<RealType> Fn,
                                std::vector<RealType> F, RealType F3plus,
                                RealType F3minus, RealType eta, RealType Fe) {
    if (isEAM()) {
      at_->removeProperty(EAMtypeID);
      at_->removeProperty(ZhouTypeID);
    }

    EAMParameters eamParam {};
    ZhouParameters zhouParam {};

    eamParam.eamType = eamZhou2005;

    toUpper(latticeType);
    eamParam.latticeType = latticeType;
    // default to FCC if we don't specify HCP or BCC:
    if (latticeType == "HCP")
      eamParam.latticeConstant = re;
    else if (latticeType == "BCC")
      eamParam.latticeConstant = 2.0 * re / sqrt(3.0);
    else
      eamParam.latticeConstant = 2.0 * re / sqrt(2.0);

    zhouParam.re      = re;
    zhouParam.fe      = fe;
    zhouParam.rhoe    = rhoe;
    zhouParam.alpha   = alpha;
    zhouParam.beta    = beta;
    zhouParam.A       = A;
    zhouParam.B       = B;
    zhouParam.kappa   = kappa;
    zhouParam.lambda  = lambda;
    zhouParam.Fn      = Fn;
    zhouParam.F       = F;
    zhouParam.F3plus  = F3plus;
    zhouParam.F3minus = F3minus;
    zhouParam.eta     = eta;
    zhouParam.Fe      = Fe;
    zhouParam.rhos    = rhos;

    at_->addProperty(std::make_shared<EAMData>(EAMtypeID, eamParam));
    at_->addProperty(std::make_shared<ZhouData>(ZhouTypeID, zhouParam));
  }